

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

void __thiscall BinHash<IPStatsRecord>::Clear(BinHash<IPStatsRecord> *this)

{
  uint uVar1;
  IPStatsRecord **ppIVar2;
  IPStatsRecord **ppIVar3;
  IPStatsRecord *x;
  IPStatsRecord *this_00;
  ulong uVar4;
  
  ppIVar3 = this->hashBin;
  if (ppIVar3 != (IPStatsRecord **)0x0) {
    uVar1 = this->tableSize;
    if (uVar1 != 0) {
      uVar4 = 0;
      do {
        this_00 = ppIVar3[uVar4];
        if (this_00 != (IPStatsRecord *)0x0) {
          ppIVar2 = ppIVar3 + uVar4;
          do {
            *ppIVar2 = this_00->HashNext;
            IPStatsRecord::~IPStatsRecord(this_00);
            operator_delete(this_00);
            ppIVar3 = this->hashBin;
            ppIVar2 = ppIVar3 + uVar4;
            this_00 = *ppIVar2;
          } while (this_00 != (IPStatsRecord *)0x0);
          uVar1 = this->tableSize;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar1);
    }
    operator_delete__(ppIVar3);
    this->hashBin = (IPStatsRecord **)0x0;
  }
  this->tableSize = 0;
  this->tableCount = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }